

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

ON_Extrusion *
ON_Extrusion::Cylinder(ON_Cylinder *cylinder,bool bCapBottom,bool bCapTop,ON_Extrusion *extrusion)

{
  ON_3dPoint A;
  ON_3dPoint B;
  ON_3dVector up_00;
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  bool bVar13;
  bool bVar14;
  uint uVar15;
  ON_ArcCurve *this;
  double dVar16;
  ON_Extrusion *local_e0;
  ON_Extrusion *extrusion_cylinder;
  ON_ArcCurve *circle_curve;
  undefined1 auStack_b8 [8];
  ON_3dVector up;
  ON_3dPoint local_98;
  ON_3dPoint local_70;
  undefined1 auStack_58 [8];
  ON_Line path;
  ON_Extrusion *extrusion_local;
  bool bCapTop_local;
  bool bCapBottom_local;
  ON_Cylinder *cylinder_local;
  
  path.to.z = (double)extrusion;
  bVar13 = ON_Cylinder::IsValid(cylinder);
  if ((!bVar13) || (bVar13 = ON_Cylinder::IsFinite(cylinder), !bVar13)) {
    return (ON_Extrusion *)0x0;
  }
  ON_Line::ON_Line((ON_Line *)auStack_58);
  ON_Plane::PointAt(&local_70,(ON_Plane *)cylinder,0.0,0.0,cylinder->height[0]);
  path.from.y = local_70.z;
  auStack_58 = (undefined1  [8])local_70.x;
  path.from.x = local_70.y;
  ON_Plane::PointAt(&local_98,(ON_Plane *)cylinder,0.0,0.0,cylinder->height[1]);
  path.to.y = local_98.z;
  path.from.z = local_98.x;
  path.to.x = local_98.y;
  bVar13 = ON_Line::IsValid((ON_Line *)auStack_58);
  if ((!bVar13) ||
     (dVar16 = ON_Line::Length((ON_Line *)auStack_58), dVar16 <= 2.3283064365386963e-10)) {
    cylinder_local = (ON_Cylinder *)0x0;
  }
  else {
    up.y = (cylinder->circle).plane.yaxis.z;
    auStack_b8 = (undefined1  [8])(cylinder->circle).plane.yaxis.x;
    up.x = (cylinder->circle).plane.yaxis.y;
    bVar14 = ON_3dVector::IsValid((ON_3dVector *)auStack_b8);
    bVar13 = true;
    if (bVar14) {
      bVar14 = ON_3dVector::IsUnitVector((ON_3dVector *)auStack_b8);
      bVar13 = true;
      if (bVar14) {
        ON_Line::Tangent((ON_3dVector *)&circle_curve,(ON_Line *)auStack_58);
        dVar16 = ON_3dVector::operator*((ON_3dVector *)auStack_b8,(ON_3dVector *)&circle_curve);
        bVar13 = 1.490116119385e-08 < ABS(dVar16);
      }
    }
    if (bVar13) {
      cylinder_local = (ON_Cylinder *)0x0;
    }
    else {
      this = (ON_ArcCurve *)operator_new(0xc0);
      ON_ArcCurve::ON_ArcCurve(this,&cylinder->circle);
      dVar16 = ON_Plane::World_xy.plane_equation.d;
      (this->m_arc).super_ON_Circle.plane.plane_equation.z = ON_Plane::World_xy.plane_equation.z;
      (this->m_arc).super_ON_Circle.plane.plane_equation.d = dVar16;
      dVar16 = ON_Plane::World_xy.plane_equation.y;
      (this->m_arc).super_ON_Circle.plane.plane_equation.x = ON_Plane::World_xy.plane_equation.x;
      (this->m_arc).super_ON_Circle.plane.plane_equation.y = dVar16;
      dVar16 = ON_Plane::World_xy.zaxis.z;
      (this->m_arc).super_ON_Circle.plane.zaxis.y = ON_Plane::World_xy.zaxis.y;
      (this->m_arc).super_ON_Circle.plane.zaxis.z = dVar16;
      dVar16 = ON_Plane::World_xy.zaxis.x;
      (this->m_arc).super_ON_Circle.plane.yaxis.z = ON_Plane::World_xy.yaxis.z;
      (this->m_arc).super_ON_Circle.plane.zaxis.x = dVar16;
      uVar12 = ON_Plane::World_xy.yaxis.y._4_4_;
      uVar11 = ON_Plane::World_xy.yaxis.y._0_4_;
      uVar10 = ON_Plane::World_xy.yaxis.x._4_4_;
      uVar9 = ON_Plane::World_xy.xaxis.z._4_4_;
      uVar8 = ON_Plane::World_xy.xaxis.z._0_4_;
      uVar7 = ON_Plane::World_xy.xaxis.y._4_4_;
      uVar6 = ON_Plane::World_xy.xaxis.y._0_4_;
      uVar5 = ON_Plane::World_xy.xaxis.x._4_4_;
      uVar4 = ON_Plane::World_xy.xaxis.x._0_4_;
      uVar3 = ON_Plane::World_xy.origin.z._4_4_;
      uVar2 = ON_Plane::World_xy.origin.z._0_4_;
      dVar1 = ON_Plane::World_xy.origin.y;
      dVar16 = ON_Plane::World_xy.origin.x;
      *(undefined4 *)&(this->m_arc).super_ON_Circle.plane.yaxis.x = ON_Plane::World_xy.yaxis.x._0_4_
      ;
      *(undefined4 *)((long)&(this->m_arc).super_ON_Circle.plane.yaxis.x + 4) = uVar10;
      *(undefined4 *)&(this->m_arc).super_ON_Circle.plane.yaxis.y = uVar11;
      *(undefined4 *)((long)&(this->m_arc).super_ON_Circle.plane.yaxis.y + 4) = uVar12;
      *(undefined4 *)&(this->m_arc).super_ON_Circle.plane.xaxis.y = uVar6;
      *(undefined4 *)((long)&(this->m_arc).super_ON_Circle.plane.xaxis.y + 4) = uVar7;
      *(undefined4 *)&(this->m_arc).super_ON_Circle.plane.xaxis.z = uVar8;
      *(undefined4 *)((long)&(this->m_arc).super_ON_Circle.plane.xaxis.z + 4) = uVar9;
      *(undefined4 *)&(this->m_arc).super_ON_Circle.plane.origin.z = uVar2;
      *(undefined4 *)((long)&(this->m_arc).super_ON_Circle.plane.origin.z + 4) = uVar3;
      *(undefined4 *)&(this->m_arc).super_ON_Circle.plane.xaxis.x = uVar4;
      *(undefined4 *)((long)&(this->m_arc).super_ON_Circle.plane.xaxis.x + 4) = uVar5;
      (this->m_arc).super_ON_Circle.plane.origin.x = dVar16;
      (this->m_arc).super_ON_Circle.plane.origin.y = dVar1;
      this->m_dim = 2;
      uVar15 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])
                         (this,0);
      if ((uVar15 & 1) == 0) {
        if (this != (ON_ArcCurve *)0x0) {
          (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
        }
        cylinder_local = (ON_Cylinder *)0x0;
      }
      else {
        if (path.to.z == 0.0) {
          local_e0 = (ON_Extrusion *)operator_new(0xd0);
          ON_Extrusion(local_e0);
        }
        else {
          Destroy((ON_Extrusion *)path.to.z);
          local_e0 = (ON_Extrusion *)path.to.z;
        }
        A.y = path.from.x;
        A.x = (double)auStack_58;
        A.z = path.from.y;
        B.y = path.to.x;
        B.x = path.from.z;
        B.z = path.to.y;
        up_00.y = up.x;
        up_00.x = (double)auStack_b8;
        up_00.z = up.y;
        bVar13 = SetPathAndUp(local_e0,A,B,up_00);
        if (((bVar13) && (bVar13 = SetOuterProfile(local_e0,(ON_Curve *)this,false), bVar13)) &&
           (uVar15 = (*(local_e0->super_ON_Surface).super_ON_Geometry.super_ON_Object.
                       _vptr_ON_Object[6])(local_e0,0), (uVar15 & 1) != 0)) {
          uVar15 = PathParameter(local_e0);
          uVar15 = (*(local_e0->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                     [0x25])(cylinder->height[0],SUB84(cylinder->height[1],0),local_e0,(ulong)uVar15
                            );
          if ((uVar15 & 1) != 0) {
            local_e0->m_bCap[0] = bCapBottom;
            local_e0->m_bCap[1] = bCapTop;
            uVar15 = (*(local_e0->super_ON_Surface).super_ON_Geometry.super_ON_Object.
                       _vptr_ON_Object[6])(local_e0,0);
            if ((uVar15 & 1) == 0) {
              if ((path.to.z == 0.0) && (local_e0 != (ON_Extrusion *)0x0)) {
                (*(local_e0->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])
                          ();
              }
              cylinder_local = (ON_Cylinder *)0x0;
            }
            else {
              cylinder_local = (ON_Cylinder *)local_e0;
            }
            goto LAB_004f7b9b;
          }
        }
        if ((path.to.z == 0.0) && (local_e0 != (ON_Extrusion *)0x0)) {
          (*(local_e0->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
        }
        cylinder_local = (ON_Cylinder *)0x0;
      }
    }
  }
LAB_004f7b9b:
  up.z._4_4_ = 1;
  ON_Line::~ON_Line((ON_Line *)auStack_58);
  return (ON_Extrusion *)cylinder_local;
}

Assistant:

ON_Extrusion* ON_Extrusion::Cylinder( 
  const ON_Cylinder& cylinder, 
  bool bCapBottom,
  bool bCapTop,
  ON_Extrusion* extrusion
  )
{
  if ( !cylinder.IsValid() || !cylinder.IsFinite() )
    return 0;

  ON_Line path;
  path.from = cylinder.circle.plane.PointAt(0.0,0.0,cylinder.height[0]);
  path.to   = cylinder.circle.plane.PointAt(0.0,0.0,cylinder.height[1]);
  if ( !path.IsValid() || !(path.Length() > ON_ZERO_TOLERANCE) )
    return 0;

  ON_3dVector up = cylinder.circle.plane.yaxis;
  if (    !up.IsValid()
       || !up.IsUnitVector()
       || fabs(up*path.Tangent()) > ON_SQRT_EPSILON 
       )
    return 0;

  ON_ArcCurve* circle_curve = new ON_ArcCurve(cylinder.circle);
  circle_curve->m_arc.plane = ON_Plane::World_xy;
  circle_curve->m_dim = 2;
  if ( !circle_curve->IsValid() )
  {
    delete circle_curve;
    return 0;
  }

  ON_Extrusion* extrusion_cylinder = 0;
  if ( extrusion )
  {
    extrusion->Destroy();
    extrusion_cylinder = extrusion;
  }
  else
  {
    extrusion_cylinder = new ON_Extrusion();
  }

  if (    !extrusion_cylinder->SetPathAndUp(path.from,path.to,up)
       || !extrusion_cylinder->SetOuterProfile(circle_curve,false)
       || !extrusion_cylinder->IsValid()
       || !extrusion_cylinder->SetDomain(extrusion_cylinder->PathParameter(),cylinder.height[0],cylinder.height[1])
     )
  {
    if ( 0 == extrusion )
      delete extrusion_cylinder;
    return 0;
  }

  extrusion_cylinder->m_bCap[0] = bCapBottom ? true : false;
  extrusion_cylinder->m_bCap[1] = bCapTop    ? true : false;

  if ( !extrusion_cylinder->IsValid() )
  {
    if ( 0 == extrusion )
      delete extrusion_cylinder;
    return 0;
  }

  return extrusion_cylinder;
}